

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::status_internal::(anonymous_namespace)::StatusCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,StatusCode code)

{
  char *pcVar1;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "OK";
    break;
  case 1:
    pcVar1 = "CANCELLED";
    break;
  default:
    pcVar1 = "UNKNOWN";
    break;
  case 3:
    pcVar1 = "INVALID_ARGUMENT";
    break;
  case 4:
    pcVar1 = "DEADLINE_EXCEEDED";
    break;
  case 5:
    pcVar1 = "NOT_FOUND";
    break;
  case 6:
    pcVar1 = "ALREADY_EXISTS";
    break;
  case 7:
    pcVar1 = "PERMISSION_DENIED";
    break;
  case 8:
    pcVar1 = "RESOURCE_EXHAUSTED";
    break;
  case 9:
    pcVar1 = "FAILED_PRECONDITION";
    break;
  case 10:
    pcVar1 = "ABORTED";
    break;
  case 0xb:
    pcVar1 = "OUT_OF_RANGE";
    break;
  case 0xc:
    pcVar1 = "UNIMPLEMENTED";
    break;
  case 0xd:
    pcVar1 = "INTERNAL";
    break;
  case 0xe:
    pcVar1 = "UNAVAILABLE";
    break;
  case 0xf:
    pcVar1 = "DATA_LOSS";
    break;
  case 0x10:
    pcVar1 = "UNAUTHENTICATED";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

inline std::string StatusCodeToString(StatusCode code) {
  switch (code) {
    case StatusCode::kOk:
      return "OK";
    case StatusCode::kCancelled:
      return "CANCELLED";
    case StatusCode::kUnknown:
      return "UNKNOWN";
    case StatusCode::kInvalidArgument:
      return "INVALID_ARGUMENT";
    case StatusCode::kDeadlineExceeded:
      return "DEADLINE_EXCEEDED";
    case StatusCode::kNotFound:
      return "NOT_FOUND";
    case StatusCode::kAlreadyExists:
      return "ALREADY_EXISTS";
    case StatusCode::kPermissionDenied:
      return "PERMISSION_DENIED";
    case StatusCode::kUnauthenticated:
      return "UNAUTHENTICATED";
    case StatusCode::kResourceExhausted:
      return "RESOURCE_EXHAUSTED";
    case StatusCode::kFailedPrecondition:
      return "FAILED_PRECONDITION";
    case StatusCode::kAborted:
      return "ABORTED";
    case StatusCode::kOutOfRange:
      return "OUT_OF_RANGE";
    case StatusCode::kUnimplemented:
      return "UNIMPLEMENTED";
    case StatusCode::kInternal:
      return "INTERNAL";
    case StatusCode::kUnavailable:
      return "UNAVAILABLE";
    case StatusCode::kDataLoss:
      return "DATA_LOSS";
  }

  // No default clause, clang will abort if a code is missing from
  // above switch.
  return "UNKNOWN";
}